

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

bool __thiscall TypeInfo::testInBuiltTypesOnAttributes(TypeInfo *this,bool DTDPresent)

{
  wchar16 wVar1;
  wchar16 wVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  short sVar5;
  short sVar6;
  DOMElement *pDVar7;
  long *plVar8;
  wchar16 *pwVar9;
  wchar16 *pwVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  ostream *poVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  long *plVar17;
  short *psVar18;
  short *psVar19;
  bool bVar20;
  XStr local_48;
  XStr local_40;
  XStr local_38;
  
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar7 = findElement(this,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
  pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x10))(plVar8);
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar20 = true;
  if (pwVar9 != local_48.fUnicodeForm) {
    pwVar10 = local_48.fUnicodeForm;
    if (local_48.fUnicodeForm == (wchar16 *)0x0 || pwVar9 == (wchar16 *)0x0) {
      if (pwVar9 == (wchar16 *)0x0) {
        if (local_48.fUnicodeForm != (wchar16 *)0x0) goto LAB_001034fb;
      }
      else {
        bVar20 = *pwVar9 == L'\0';
        if ((local_48.fUnicodeForm != (wchar16 *)0x0) && (*pwVar9 == L'\0')) {
LAB_001034fb:
          bVar20 = *pwVar10 == L'\0';
        }
      }
    }
    else {
      do {
        wVar1 = *pwVar9;
        if (wVar1 == L'\0') goto LAB_001034fb;
        pwVar9 = pwVar9 + 1;
        wVar2 = *pwVar10;
        pwVar10 = pwVar10 + 1;
      } while (wVar1 == wVar2);
      bVar20 = false;
    }
  }
  if (bVar20) {
    plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
    pXVar11 = (XMLCh *)(**(code **)(*plVar8 + 0x18))(plVar8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar11 != local_38.fUnicodeForm) {
      pXVar12 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (XMLCh *)0x0 || pXVar11 == (XMLCh *)0x0) {
        if (pXVar11 == (XMLCh *)0x0) {
          if (local_38.fUnicodeForm != (XMLCh *)0x0) goto LAB_00103594;
        }
        else {
          tmp = *pXVar11 == L'\0';
          if ((local_38.fUnicodeForm != (XMLCh *)0x0) && (*pXVar11 == L'\0')) {
LAB_00103594:
            tmp = *pXVar12 == L'\0';
          }
        }
      }
      else {
        do {
          XVar3 = *pXVar11;
          if (XVar3 == L'\0') goto LAB_00103594;
          pXVar11 = pXVar11 + 1;
          XVar4 = *pXVar12;
          pXVar12 = pXVar12 + 1;
        } while (XVar3 == XVar4);
        tmp = false;
      }
    }
    if (bVar20) {
      XStr::~XStr(&local_38);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_48);
  bVar20 = true;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                (local_48.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    XStr::~XStr(&local_40);
    XStr::~XStr(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
    lVar16 = (**(code **)(*plVar8 + 0x10))(plVar8);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010376b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x10))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010376b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
    lVar16 = (**(code **)(*plVar8 + 0x18))(plVar8);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00103812:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x1d8))(pDVar7);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00103812;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("anySimpleType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE) {
LAB_001038e9:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00103938;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010392f;
      }
LAB_00103938:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00103bc6;
      goto LAB_00103949;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE;
    if (psVar18 == (short *)0x0) {
LAB_001038e3:
      if (*psVar19 == 0) goto LAB_001038e9;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001038e3;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010392f:
    tmp = false;
LAB_00103949:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00103ab6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00103ab6;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00103b69:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00103b69;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00103bc6:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING) {
LAB_00103c40:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00103c8f;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00103c86;
      }
LAB_00103c8f:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00103f1d;
      goto LAB_00103ca0;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING;
    if (psVar18 == (short *)0x0) {
LAB_00103c3a:
      if (*psVar19 == 0) goto LAB_00103c40;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00103c3a;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00103c86:
    tmp = false;
LAB_00103ca0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00103e0d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00103e0d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00103ec0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00103ec0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00103f1d:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("boolean",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN) {
LAB_00103f97:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00103fe6;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00103fdd;
      }
LAB_00103fe6:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00104274;
      goto LAB_00103ff7;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN;
    if (psVar18 == (short *)0x0) {
LAB_00103f91:
      if (*psVar19 == 0) goto LAB_00103f97;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00103f91;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00103fdd:
    tmp = false;
LAB_00103ff7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xab);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104164:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104164;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104217:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104217;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00104274:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL) {
LAB_001042ee:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010433d;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00104334;
      }
LAB_0010433d:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001045cb;
      goto LAB_0010434e;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL;
    if (psVar18 == (short *)0x0) {
LAB_001042e8:
      if (*psVar19 == 0) goto LAB_001042ee;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001042e8;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00104334:
    tmp = false;
LAB_0010434e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xae);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001044bb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001044bb;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010456e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010456e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001045cb:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("float",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT) {
LAB_00104645:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00104694;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010468b;
      }
LAB_00104694:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00104922;
      goto LAB_001046a5;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT;
    if (psVar18 == (short *)0x0) {
LAB_0010463f:
      if (*psVar19 == 0) goto LAB_00104645;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010463f;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010468b:
    tmp = false;
LAB_001046a5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104812:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104812;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001048c5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001048c5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00104922:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("double",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE) {
LAB_0010499c:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001049eb;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001049e2;
      }
LAB_001049eb:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00104c79;
      goto LAB_001049fc;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE;
    if (psVar18 == (short *)0x0) {
LAB_00104996:
      if (*psVar19 == 0) goto LAB_0010499c;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00104996;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001049e2:
    tmp = false;
LAB_001049fc:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104b69:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104b69;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104c1c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104c1c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00104c79:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("duration",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION) {
LAB_00104cf3:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00104d42;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00104d39;
      }
LAB_00104d42:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00104fd0;
      goto LAB_00104d53;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION;
    if (psVar18 == (short *)0x0) {
LAB_00104ced:
      if (*psVar19 == 0) goto LAB_00104cf3;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00104ced;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00104d39:
    tmp = false;
LAB_00104d53:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104ec0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104ec0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00104f73:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00104f73;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00104fd0:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("dateTime",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME) {
LAB_0010504a:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00105099;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00105090;
      }
LAB_00105099:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00105327;
      goto LAB_001050aa;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME;
    if (psVar18 == (short *)0x0) {
LAB_00105044:
      if (*psVar19 == 0) goto LAB_0010504a;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00105044;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00105090:
    tmp = false;
LAB_001050aa:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105217:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105217;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001052ca:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001052ca;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00105327:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("time",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_TIME) {
LAB_001053a1:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001053f0;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001053e7;
      }
LAB_001053f0:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010567e;
      goto LAB_00105401;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_TIME;
    if (psVar18 == (short *)0x0) {
LAB_0010539b:
      if (*psVar19 == 0) goto LAB_001053a1;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010539b;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001053e7:
    tmp = false;
LAB_00105401:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010556e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010556e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105621:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105621;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010567e:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("date",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATE) {
LAB_001056f8:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00105747;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010573e;
      }
LAB_00105747:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001059d5;
      goto LAB_00105758;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DATE;
    if (psVar18 == (short *)0x0) {
LAB_001056f2:
      if (*psVar19 == 0) goto LAB_001056f8;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001056f2;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010573e:
    tmp = false;
LAB_00105758:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001058c5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001058c5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105978:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105978;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001059d5:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gYearMonth",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH) {
LAB_00105a4f:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00105a9e;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00105a95;
      }
LAB_00105a9e:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00105d2c;
      goto LAB_00105aaf;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH;
    if (psVar18 == (short *)0x0) {
LAB_00105a49:
      if (*psVar19 == 0) goto LAB_00105a4f;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00105a49;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00105a95:
    tmp = false;
LAB_00105aaf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105c1c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105c1c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105ccf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105ccf;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00105d2c:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gYear",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR) {
LAB_00105da6:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00105df5;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00105dec;
      }
LAB_00105df5:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00106083;
      goto LAB_00105e06;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR;
    if (psVar18 == (short *)0x0) {
LAB_00105da0:
      if (*psVar19 == 0) goto LAB_00105da6;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00105da0;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00105dec:
    tmp = false;
LAB_00105e06:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00105f73:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00105f73;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106026:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106026;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00106083:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gMonthDay",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY) {
LAB_001060fd:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010614c;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00106143;
      }
LAB_0010614c:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001063da;
      goto LAB_0010615d;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY;
    if (psVar18 == (short *)0x0) {
LAB_001060f7:
      if (*psVar19 == 0) goto LAB_001060fd;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001060f7;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00106143:
    tmp = false;
LAB_0010615d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001062ca:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001062ca;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010637d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010637d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001063da:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gDay",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_DAY) {
LAB_00106454:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001064a3;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010649a;
      }
LAB_001064a3:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00106731;
      goto LAB_001064b4;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_DAY;
    if (psVar18 == (short *)0x0) {
LAB_0010644e:
      if (*psVar19 == 0) goto LAB_00106454;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010644e;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010649a:
    tmp = false;
LAB_001064b4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106621:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106621;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001066d4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001066d4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00106731:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("gMonth",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH) {
LAB_001067ab:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001067fa;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001067f1;
      }
LAB_001067fa:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00106a88;
      goto LAB_0010680b;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH;
    if (psVar18 == (short *)0x0) {
LAB_001067a5:
      if (*psVar19 == 0) goto LAB_001067ab;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001067a5;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001067f1:
    tmp = false;
LAB_0010680b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106978:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106978;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106a2b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106a2b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00106a88:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("hexBinary",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY) {
LAB_00106b02:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00106b51;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00106b48;
      }
LAB_00106b51:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00106ddf;
      goto LAB_00106b62;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY;
    if (psVar18 == (short *)0x0) {
LAB_00106afc:
      if (*psVar19 == 0) goto LAB_00106b02;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00106afc;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00106b48:
    tmp = false;
LAB_00106b62:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106ccf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106ccf;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00106d82:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00106d82;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00106ddf:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("base64Binary",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY) {
LAB_00106e59:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00106ea8;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00106e9f;
      }
LAB_00106ea8:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00107136;
      goto LAB_00106eb9;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY;
    if (psVar18 == (short *)0x0) {
LAB_00106e53:
      if (*psVar19 == 0) goto LAB_00106e59;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00106e53;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00106e9f:
    tmp = false;
LAB_00106eb9:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107026:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107026;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001070d9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001070d9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00107136:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("anyURI",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_001071b0:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001071ff;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001071f6;
      }
LAB_001071ff:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010748d;
      goto LAB_00107210;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar18 == (short *)0x0) {
LAB_001071aa:
      if (*psVar19 == 0) goto LAB_001071b0;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001071aa;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001071f6:
    tmp = false;
LAB_00107210:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010737d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010737d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107430:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107430;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010748d:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("QName",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME) {
LAB_00107507:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00107556;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010754d;
      }
LAB_00107556:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001077e4;
      goto LAB_00107567;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME;
    if (psVar18 == (short *)0x0) {
LAB_00107501:
      if (*psVar19 == 0) goto LAB_00107507;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00107501;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010754d:
    tmp = false;
LAB_00107567:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001076d4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001076d4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107787:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107787;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001077e4:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("normalizedString",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING) {
LAB_0010785e:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001078ad;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001078a4;
      }
LAB_001078ad:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00107b3b;
      goto LAB_001078be;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING;
    if (psVar18 == (short *)0x0) {
LAB_00107858:
      if (*psVar19 == 0) goto LAB_0010785e;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00107858;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001078a4:
    tmp = false;
LAB_001078be:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xde);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107a2b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107a2b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107ade:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107ade;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00107b3b:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("token",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN) {
LAB_00107bb5:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00107c04;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00107bfb;
      }
LAB_00107c04:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00107e92;
      goto LAB_00107c15;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN;
    if (psVar18 == (short *)0x0) {
LAB_00107baf:
      if (*psVar19 == 0) goto LAB_00107bb5;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00107baf;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00107bfb:
    tmp = false;
LAB_00107c15:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107d82:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107d82;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00107e35:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00107e35;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00107e92:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("language",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE) {
LAB_00107f0c:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00107f5b;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00107f52;
      }
LAB_00107f5b:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001081e9;
      goto LAB_00107f6c;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE;
    if (psVar18 == (short *)0x0) {
LAB_00107f06:
      if (*psVar19 == 0) goto LAB_00107f0c;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00107f06;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00107f52:
    tmp = false;
LAB_00107f6c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001080d9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001080d9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010818c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010818c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001081e9:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NMTOKEN",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgNmTokenString) {
LAB_00108263:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001082b2;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001082a9;
      }
LAB_001082b2:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00108540;
      goto LAB_001082c3;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::XMLUni::fgNmTokenString;
    if (psVar18 == (short *)0x0) {
LAB_0010825d:
      if (*psVar19 == 0) goto LAB_00108263;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010825d;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001082a9:
    tmp = false;
LAB_001082c3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108430:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108430;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001084e3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001084e3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00108540:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NMTOKENS",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgNmTokensString) {
LAB_001085ba:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00108609;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00108600;
      }
LAB_00108609:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00108897;
      goto LAB_0010861a;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::XMLUni::fgNmTokensString;
    if (psVar18 == (short *)0x0) {
LAB_001085b4:
      if (*psVar19 == 0) goto LAB_001085ba;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_001085b4;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00108600:
    tmp = false;
LAB_0010861a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108787:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108787;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010883a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010883a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00108897:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("Name",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NAME) {
LAB_00108911:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00108960;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00108957;
      }
LAB_00108960:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00108bee;
      goto LAB_00108971;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NAME;
    if (psVar18 == (short *)0x0) {
LAB_0010890b:
      if (*psVar19 == 0) goto LAB_00108911;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010890b;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00108957:
    tmp = false;
LAB_00108971:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xed);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108ade:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108ade;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108b91:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108b91;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00108bee:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("NCName",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME) {
LAB_00108c68:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00108cb7;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00108cae;
      }
LAB_00108cb7:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_00108f45;
      goto LAB_00108cc8;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME;
    if (psVar18 == (short *)0x0) {
LAB_00108c62:
      if (*psVar19 == 0) goto LAB_00108c68;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00108c62;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00108cae:
    tmp = false;
LAB_00108cc8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108e35:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108e35;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00108ee8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00108ee8;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_00108f45:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("ID",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgIDString) {
LAB_00108fbf:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010900e;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00109005;
      }
LAB_0010900e:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010929c;
      goto LAB_0010901f;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::XMLUni::fgIDString;
    if (psVar18 == (short *)0x0) {
LAB_00108fb9:
      if (*psVar19 == 0) goto LAB_00108fbf;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00108fb9;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_00109005:
    tmp = false;
LAB_0010901f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010918c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010918c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010923f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010923f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010929c:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("IDREF",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgIDRefString) {
LAB_00109316:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00109365;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010935c;
      }
LAB_00109365:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_001095f3;
      goto LAB_00109376;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::XMLUni::fgIDRefString;
    if (psVar18 == (short *)0x0) {
LAB_00109310:
      if (*psVar19 == 0) goto LAB_00109316;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00109310;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010935c:
    tmp = false;
LAB_00109376:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001094e3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001094e3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00109596:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00109596;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_001095f3:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("IDREFS",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgIDRefsString) {
LAB_0010966d:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001096bc;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_001096b3;
      }
LAB_001096bc:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010994a;
      goto LAB_001096cd;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::XMLUni::fgIDRefsString;
    if (psVar18 == (short *)0x0) {
LAB_00109667:
      if (*psVar19 == 0) goto LAB_0010966d;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_00109667;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_001096b3:
    tmp = false;
LAB_001096cd:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010983a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010983a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_001098ed:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_001098ed;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010994a:
  if (DTDPresent) {
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("ENTITY",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
    XStr::~XStr(&local_48);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
    if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgEntityString) {
LAB_001099cd:
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
      if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
        psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
        if (psVar18 != (short *)0x0) {
          do {
            sVar5 = *psVar18;
            if (sVar5 == 0) goto LAB_00109a1c;
            psVar18 = psVar18 + 1;
            sVar6 = *psVar19;
            psVar19 = psVar19 + 1;
          } while (sVar5 == sVar6);
          goto LAB_00109a13;
        }
LAB_00109a1c:
        tmp = *psVar19 == 0;
        if (tmp) goto LAB_00109caa;
        goto LAB_00109a2d;
      }
      tmp = true;
    }
    else {
      psVar19 = (short *)&xercesc_4_0::XMLUni::fgEntityString;
      if (psVar18 == (short *)0x0) {
LAB_001099c7:
        if (*psVar19 == 0) goto LAB_001099cd;
      }
      else {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_001099c7;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
      }
LAB_00109a13:
      tmp = false;
LAB_00109a2d:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"\nExpected values : typename \'",0x1d);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
      }
      else {
        sVar15 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
      }
      else {
        sVar15 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
      if (lVar16 == 0) {
        pcVar14 = "(null)";
        sVar15 = 6;
LAB_00109b9a:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
      }
      else {
        plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
        pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
        pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        if (pcVar14 != (char *)0x0) {
          sVar15 = strlen(pcVar14);
          goto LAB_00109b9a;
        }
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
      if (lVar16 == 0) {
        pcVar14 = "(null)";
        sVar15 = 6;
LAB_00109c4d:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
      }
      else {
        plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
        pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
        pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        if (pcVar14 != (char *)0x0) {
          sVar15 = strlen(pcVar14);
          goto LAB_00109c4d;
        }
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      bVar20 = false;
    }
LAB_00109caa:
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("ENTITIES",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
    XStr::~XStr(&local_48);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
    if (psVar18 == (short *)&xercesc_4_0::XMLUni::fgEntitiesString) {
LAB_00109d24:
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
      if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
        tmp = true;
        goto LAB_0010a001;
      }
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00109d73;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_00109d6a;
      }
LAB_00109d73:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010a001;
    }
    else {
      psVar19 = (short *)&xercesc_4_0::XMLUni::fgEntitiesString;
      if (psVar18 == (short *)0x0) {
LAB_00109d1e:
        if (*psVar19 == 0) goto LAB_00109d24;
      }
      else {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_00109d1e;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
      }
LAB_00109d6a:
      tmp = false;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x101);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00109ef1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00109ef1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_00109fa4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_00109fa4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010a001:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("integer",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER) {
LAB_0010a07b:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010a0ca;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010a0c1;
      }
LAB_0010a0ca:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010a358;
      goto LAB_0010a0db;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010a075:
      if (*psVar19 == 0) goto LAB_0010a07b;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010a075;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010a0c1:
    tmp = false;
LAB_0010a0db:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a248:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a248;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a2fb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a2fb;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010a358:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("nonPositiveInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER) {
LAB_0010a3d2:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010a421;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010a418;
      }
LAB_0010a421:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010a6af;
      goto LAB_0010a432;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010a3cc:
      if (*psVar19 == 0) goto LAB_0010a3d2;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010a3cc;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010a418:
    tmp = false;
LAB_0010a432:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a59f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a59f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a652:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a652;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010a6af:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("negativeInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER) {
LAB_0010a729:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010a778;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010a76f;
      }
LAB_0010a778:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010aa06;
      goto LAB_0010a789;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010a723:
      if (*psVar19 == 0) goto LAB_0010a729;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010a723;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010a76f:
    tmp = false;
LAB_0010a789:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a8f6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a8f6;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010a9a9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010a9a9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010aa06:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("long",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_LONG) {
LAB_0010aa80:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010aacf;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010aac6;
      }
LAB_0010aacf:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010ad5d;
      goto LAB_0010aae0;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_LONG;
    if (psVar18 == (short *)0x0) {
LAB_0010aa7a:
      if (*psVar19 == 0) goto LAB_0010aa80;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010aa7a;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010aac6:
    tmp = false;
LAB_0010aae0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010ac4d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010ac4d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010ad00:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010ad00;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010ad5d:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("int",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INT) {
LAB_0010add7:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010ae26;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010ae1d;
      }
LAB_0010ae26:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010b0b4;
      goto LAB_0010ae37;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INT;
    if (psVar18 == (short *)0x0) {
LAB_0010add1:
      if (*psVar19 == 0) goto LAB_0010add7;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010add1;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010ae1d:
    tmp = false;
LAB_0010ae37:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010afa4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010afa4;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b057:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b057;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010b0b4:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("short",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT) {
LAB_0010b12e:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010b17d;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010b174;
      }
LAB_0010b17d:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010b40b;
      goto LAB_0010b18e;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT;
    if (psVar18 == (short *)0x0) {
LAB_0010b128:
      if (*psVar19 == 0) goto LAB_0010b12e;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010b128;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010b174:
    tmp = false;
LAB_0010b18e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x114);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b2fb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b2fb;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b3ae:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b3ae;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010b40b:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("byte",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE) {
LAB_0010b485:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010b4d4;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010b4cb;
      }
LAB_0010b4d4:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010b762;
      goto LAB_0010b4e5;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE;
    if (psVar18 == (short *)0x0) {
LAB_0010b47f:
      if (*psVar19 == 0) goto LAB_0010b485;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010b47f;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010b4cb:
    tmp = false;
LAB_0010b4e5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x117);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b652:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b652;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b705:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b705;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010b762:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("nonNegativeInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER) {
LAB_0010b7dc:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010b82b;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010b822;
      }
LAB_0010b82b:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010bab9;
      goto LAB_0010b83c;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010b7d6:
      if (*psVar19 == 0) goto LAB_0010b7dc;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010b7d6;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010b822:
    tmp = false;
LAB_0010b83c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010b9a9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010b9a9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010ba5c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010ba5c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010bab9:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedLong",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG) {
LAB_0010bb33:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010bb82;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010bb79;
      }
LAB_0010bb82:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010be10;
      goto LAB_0010bb93;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG;
    if (psVar18 == (short *)0x0) {
LAB_0010bb2d:
      if (*psVar19 == 0) goto LAB_0010bb33;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010bb2d;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010bb79:
    tmp = false;
LAB_0010bb93:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010bd00:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010bd00;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010bdb3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010bdb3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010be10:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedInt",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_UINT) {
LAB_0010be8a:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010bed9;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010bed0;
      }
LAB_0010bed9:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010c167;
      goto LAB_0010beea;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_UINT;
    if (psVar18 == (short *)0x0) {
LAB_0010be84:
      if (*psVar19 == 0) goto LAB_0010be8a;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010be84;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010bed0:
    tmp = false;
LAB_0010beea:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c057:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c057;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c10a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c10a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010c167:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedShort",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT) {
LAB_0010c1e1:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010c230;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010c227;
      }
LAB_0010c230:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010c4be;
      goto LAB_0010c241;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT;
    if (psVar18 == (short *)0x0) {
LAB_0010c1db:
      if (*psVar19 == 0) goto LAB_0010c1e1;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010c1db;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010c227:
    tmp = false;
LAB_0010c241:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x123);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c3ae:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c3ae;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c461:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c461;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010c4be:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unsignedByte",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE) {
LAB_0010c538:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010c587;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010c57e;
      }
LAB_0010c587:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010c815;
      goto LAB_0010c598;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE;
    if (psVar18 == (short *)0x0) {
LAB_0010c532:
      if (*psVar19 == 0) goto LAB_0010c538;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010c532;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010c57e:
    tmp = false;
LAB_0010c598:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c705:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c705;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010c7b8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010c7b8;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010c815:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("positiveInteger",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER) {
LAB_0010c88f:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010c8de;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010c8d5;
      }
LAB_0010c8de:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010cb6c;
      goto LAB_0010c8ef;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010c889:
      if (*psVar19 == 0) goto LAB_0010c88f;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010c889;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010c8d5:
    tmp = false;
LAB_0010c8ef:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010ca5c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010ca5c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010cb0f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010cb0f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010cb6c:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("defaultString",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING) {
LAB_0010cbe6:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010cc35;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010cc2c;
      }
LAB_0010cc35:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010cec3;
      goto LAB_0010cc46;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_STRING;
    if (psVar18 == (short *)0x0) {
LAB_0010cbe0:
      if (*psVar19 == 0) goto LAB_0010cbe6;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010cbe0;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010cc2c:
    tmp = false;
LAB_0010cc46:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x12d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010cdb3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010cdb3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010ce66:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010ce66;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010cec3:
  local_48.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("defaultInt",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,0,local_48.fUnicodeForm);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER) {
LAB_0010cf3d:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010cf8c;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010cf83;
      }
LAB_0010cf8c:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010d21a;
      goto LAB_0010cf9d;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER;
    if (psVar18 == (short *)0x0) {
LAB_0010cf37:
      if (*psVar19 == 0) goto LAB_0010cf3d;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010cf37;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010cf83:
    tmp = false;
LAB_0010cf9d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x130);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010d10a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010d10a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010d1bd:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010d1bd;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010d21a:
  pXVar11 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("http://www.w3.org/2000/xmlns/",
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_48.fUnicodeForm = pXVar11;
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prefix",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,pXVar11,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_0010d2b7:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 != (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar18 != (short *)0x0) {
        do {
          sVar5 = *psVar18;
          if (sVar5 == 0) goto LAB_0010d306;
          psVar18 = psVar18 + 1;
          sVar6 = *psVar19;
          psVar19 = psVar19 + 1;
        } while (sVar5 == sVar6);
        goto LAB_0010d2fd;
      }
LAB_0010d306:
      tmp = *psVar19 == 0;
      if (tmp) goto LAB_0010d594;
      goto LAB_0010d317;
    }
    tmp = true;
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar18 == (short *)0x0) {
LAB_0010d2b1:
      if (*psVar19 == 0) goto LAB_0010d2b7;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010d2b1;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010d2fd:
    tmp = false;
LAB_0010d317:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x134);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nExpected values : typename \'",0x1d);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010d484:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010d484;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar16 == 0) {
      pcVar14 = "(null)";
      sVar15 = 6;
LAB_0010d537:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
      pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar14 != (char *)0x0) {
        sVar15 = strlen(pcVar14);
        goto LAB_0010d537;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar20 = false;
  }
LAB_0010d594:
  pXVar11 = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ("http://www.w3.org/2001/XMLSchema-instance",
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_48.fUnicodeForm = pXVar11;
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("noNamespaceSchemaLocation",
                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x198))(pDVar7,pXVar11,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  XStr::~XStr(&local_48);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  psVar18 = (short *)(**(code **)(*plVar17 + 0x10))(plVar17);
  if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI) {
LAB_0010d631:
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar18 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar18 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
      return bVar20;
    }
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
    if (psVar18 != (short *)0x0) {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010d680;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
      goto LAB_0010d677;
    }
LAB_0010d680:
    tmp = *psVar19 == 0;
    if (tmp) {
      return bVar20;
    }
  }
  else {
    psVar19 = (short *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI;
    if (psVar18 == (short *)0x0) {
LAB_0010d62b:
      if (*psVar19 == 0) goto LAB_0010d631;
    }
    else {
      do {
        sVar5 = *psVar18;
        if (sVar5 == 0) goto LAB_0010d62b;
        psVar18 = psVar18 + 1;
        sVar6 = *psVar19;
        psVar19 = psVar19 + 1;
      } while (sVar5 == sVar6);
    }
LAB_0010d677:
    tmp = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x137);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\nExpected values : typename \'",0x1d)
  ;
  pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
  }
  else {
    sVar15 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', uri \'",8);
  pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
  }
  else {
    sVar15 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar16 = (**(code **)(*plVar17 + 0x10))(plVar17);
  if (lVar16 == 0) {
    pcVar14 = "(null)";
    sVar15 = 6;
LAB_0010d7fe:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
  }
  else {
    plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar9 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 != (char *)0x0) {
      sVar15 = strlen(pcVar14);
      goto LAB_0010d7fe;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar17 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar16 = (**(code **)(*plVar17 + 0x18))(plVar17);
  if (lVar16 == 0) {
    pcVar14 = "(null)";
    sVar15 = 6;
  }
  else {
    plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
    pcVar14 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_0010d8d0;
    }
    sVar15 = strlen(pcVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar15);
LAB_0010d8d0:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testInBuiltTypesOnAttributes(bool DTDPresent) {

    bool passed = true;
    DOMElement *testEle = findElement(X("attrTest"));

    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrTestType"), X(""), __LINE__);

    DOMAttr *testAttr;

    testAttr = testEle->getAttributeNodeNS(0, X("anySimpleType"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("string"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("boolean"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("decimal"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("float"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("double"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("duration"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("dateTime"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("time"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("date"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYearMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYear"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonthDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("hexBinary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("base64Binary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("anyURI"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("QName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("normalizedString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NORMALIZEDSTRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("token"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TOKEN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("language"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LANGUAGE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKEN"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokenString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKENS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokensString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("Name"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NCName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("ID"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREF"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREFS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefsString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);


    if(DTDPresent) {
        testAttr = testEle->getAttributeNodeNS(0, X("ENTITY"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

        testAttr = testEle->getAttributeNodeNS(0, X("ENTITIES"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntitiesString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    }

    testAttr = testEle->getAttributeNodeNS(0, X("integer"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonPositiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONPOSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("negativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("long"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("int"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("short"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_SHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("byte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonNegativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONNEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedLong"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ULONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UINT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedShort"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_USHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedByte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UBYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("positiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_POSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //couple of defaulted ones
    testAttr = testEle->getAttributeNodeNS(0, X("defaultString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("defaultInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //ns attr
    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2000/xmlns/"), X("prefix"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2001/XMLSchema-instance"), X("noNamespaceSchemaLocation"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;
}